

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O0

void __thiscall stringToUnits_withSpace_Test::TestBody(stringToUnits_withSpace_Test *this)

{
  bool bVar1;
  uint64_t uVar2;
  char *pcVar3;
  AssertHelper local_498;
  Message local_490;
  allocator local_481;
  string local_480;
  precise_unit local_460;
  precise_unit local_450;
  undefined1 local_440 [8];
  AssertionResult gtest_ar_10;
  Message local_428;
  allocator local_419;
  string local_418;
  precise_unit local_3f8;
  precise_unit local_3e8;
  undefined1 local_3d8 [8];
  AssertionResult gtest_ar_9;
  Message local_3c0;
  allocator local_3b1;
  string local_3b0;
  precise_unit local_390;
  precise_unit local_380;
  undefined1 local_370 [8];
  AssertionResult gtest_ar_8;
  Message local_358;
  allocator local_349;
  string local_348;
  precise_unit local_328;
  precise_unit local_318;
  undefined1 local_308 [8];
  AssertionResult gtest_ar_7;
  Message local_2f0;
  allocator local_2e1;
  string local_2e0;
  precise_unit local_2c0;
  precise_unit local_2b0;
  undefined1 local_2a0 [8];
  AssertionResult gtest_ar_6;
  Message local_288;
  allocator local_279;
  string local_278;
  precise_unit local_258;
  precise_unit local_248;
  undefined1 local_238 [8];
  AssertionResult gtest_ar_5;
  Message local_220;
  allocator local_211;
  string local_210;
  precise_unit local_1f0;
  precise_unit local_1e0;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar_4;
  Message local_1b8;
  allocator local_1a9;
  string local_1a8;
  precise_unit local_188;
  precise_unit local_178;
  undefined1 local_168 [8];
  AssertionResult gtest_ar_3;
  Message local_150;
  allocator local_141;
  string local_140;
  precise_unit local_120;
  precise_unit local_110;
  undefined1 local_100 [8];
  AssertionResult gtest_ar_2;
  Message local_e8;
  allocator local_d9;
  string local_d8;
  precise_unit local_b8;
  precise_unit local_a8;
  undefined1 local_98 [8];
  AssertionResult gtest_ar_1;
  Message local_80 [3];
  allocator local_61;
  string local_60;
  precise_unit local_40;
  precise_unit local_30;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  stringToUnits_withSpace_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  local_30 = units::precise_unit::inv((precise_unit *)units::precise::m);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,"1 /m",&local_61);
  uVar2 = units::getDefaultFlags();
  local_40 = units::unit_from_string(&local_60,uVar2);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_20,"precise::m.inv()","unit_from_string(\"1 /m\")",&local_30,
             &local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_80);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x1fa,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  local_a8 = units::precise_unit::inv((precise_unit *)units::precise::m);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d8,"1  /m",&local_d9);
  uVar2 = units::getDefaultFlags();
  local_b8 = units::unit_from_string(&local_d8,uVar2);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_98,"precise::m.inv()","unit_from_string(\"1  /m\")",&local_a8,
             &local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(&local_e8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x1fb,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  local_110 = units::precise_unit::inv((precise_unit *)units::precise::m);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_140,"1   /m",&local_141);
  uVar2 = units::getDefaultFlags();
  local_120 = units::unit_from_string(&local_140,uVar2);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_100,"precise::m.inv()","unit_from_string(\"1   /m\")",&local_110,
             &local_120);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar1) {
    testing::Message::Message(&local_150);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x1fc,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_150);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_150);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  local_178 = units::precise_unit::inv((precise_unit *)units::precise::m);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1a8,"1   / m",&local_1a9);
  uVar2 = units::getDefaultFlags();
  local_188 = units::unit_from_string(&local_1a8,uVar2);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_168,"precise::m.inv()","unit_from_string(\"1   / m\")",&local_178,
             &local_188);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
  if (!bVar1) {
    testing::Message::Message(&local_1b8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_168);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x1fd,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_1b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_1b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
  local_1e0 = units::precise_unit::inv((precise_unit *)units::precise::m);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_210,"1   /  m",&local_211);
  uVar2 = units::getDefaultFlags();
  local_1f0 = units::unit_from_string(&local_210,uVar2);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_1d0,"precise::m.inv()","unit_from_string(\"1   /  m\")",&local_1e0,
             &local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator((allocator<char> *)&local_211);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
  if (!bVar1) {
    testing::Message::Message(&local_220);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x1fe,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_220);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_220);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
  local_248 = units::precise_unit::inv((precise_unit *)units::precise::m);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_278,"1   /   m",&local_279);
  uVar2 = units::getDefaultFlags();
  local_258 = units::unit_from_string(&local_278,uVar2);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_238,"precise::m.inv()","unit_from_string(\"1   /   m\")",&local_248,
             &local_258);
  std::__cxx11::string::~string((string *)&local_278);
  std::allocator<char>::~allocator((allocator<char> *)&local_279);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_238);
  if (!bVar1) {
    testing::Message::Message(&local_288);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_238);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x1ff,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_288);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_288);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_238);
  local_2b0 = units::precise_unit::inv((precise_unit *)units::precise::m);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2e0,"1/   m",&local_2e1);
  uVar2 = units::getDefaultFlags();
  local_2c0 = units::unit_from_string(&local_2e0,uVar2);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_2a0,"precise::m.inv()","unit_from_string(\"1/   m\")",&local_2b0,
             &local_2c0);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a0);
  if (!bVar1) {
    testing::Message::Message(&local_2f0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x200,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_2f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_2f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a0);
  local_318 = units::precise_unit::inv((precise_unit *)units::precise::m);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_348,"1\t/          m",&local_349);
  uVar2 = units::getDefaultFlags();
  local_328 = units::unit_from_string(&local_348,uVar2);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_308,"precise::m.inv()","unit_from_string(\"1\\t/          m\")",
             &local_318,&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::allocator<char>::~allocator((allocator<char> *)&local_349);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_308);
  if (!bVar1) {
    testing::Message::Message(&local_358);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_308);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x201,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_358);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_358);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_308);
  local_380 = units::precise_unit::inv((precise_unit *)units::precise::m);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3b0,"1\t/\tm",&local_3b1);
  uVar2 = units::getDefaultFlags();
  local_390 = units::unit_from_string(&local_3b0,uVar2);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_370,"precise::m.inv()","unit_from_string(\"1\\t/\\tm\")",&local_380,
             &local_390);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_370);
  if (!bVar1) {
    testing::Message::Message(&local_3c0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_370);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x202,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_3c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_3c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_370);
  local_3e8 = units::precise_unit::inv((precise_unit *)units::precise::m);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_418,"1/\tm",&local_419);
  uVar2 = units::getDefaultFlags();
  local_3f8 = units::unit_from_string(&local_418,uVar2);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_3d8,"precise::m.inv()","unit_from_string(\"1/\\tm\")",&local_3e8,
             &local_3f8);
  std::__cxx11::string::~string((string *)&local_418);
  std::allocator<char>::~allocator((allocator<char> *)&local_419);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d8);
  if (!bVar1) {
    testing::Message::Message(&local_428);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x203,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_428);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_428);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d8);
  local_450 = units::precise_unit::inv((precise_unit *)units::precise::m);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_480,"  1/\tm  ",&local_481);
  uVar2 = units::getDefaultFlags();
  local_460 = units::unit_from_string(&local_480,uVar2);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_440,"precise::m.inv()","unit_from_string(\"  1/\\tm  \")",&local_450,
             &local_460);
  std::__cxx11::string::~string((string *)&local_480);
  std::allocator<char>::~allocator((allocator<char> *)&local_481);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_440);
  if (!bVar1) {
    testing::Message::Message(&local_490);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_440);
    testing::internal::AssertHelper::AssertHelper
              (&local_498,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x204,pcVar3);
    testing::internal::AssertHelper::operator=(&local_498,&local_490);
    testing::internal::AssertHelper::~AssertHelper(&local_498);
    testing::Message::~Message(&local_490);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_440);
  return;
}

Assistant:

TEST(stringToUnits, withSpace)
{
    EXPECT_EQ(precise::m.inv(), unit_from_string("1 /m"));
    EXPECT_EQ(precise::m.inv(), unit_from_string("1  /m"));
    EXPECT_EQ(precise::m.inv(), unit_from_string("1   /m"));
    EXPECT_EQ(precise::m.inv(), unit_from_string("1   / m"));
    EXPECT_EQ(precise::m.inv(), unit_from_string("1   /  m"));
    EXPECT_EQ(precise::m.inv(), unit_from_string("1   /   m"));
    EXPECT_EQ(precise::m.inv(), unit_from_string("1/   m"));
    EXPECT_EQ(precise::m.inv(), unit_from_string("1\t/          m"));
    EXPECT_EQ(precise::m.inv(), unit_from_string("1\t/\tm"));
    EXPECT_EQ(precise::m.inv(), unit_from_string("1/\tm"));
    EXPECT_EQ(precise::m.inv(), unit_from_string("  1/\tm  "));
}